

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkPreparing(ConsoleReporter *this,StringRef name)

{
  bool bVar1;
  bool bVar2;
  TablePrinter *pTVar3;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *this_00;
  const_reference pvVar4;
  Column *pCVar5;
  undefined1 local_138 [8];
  string line;
  const_iterator __end1;
  const_iterator __begin1;
  Column *__range1;
  bool firstLine;
  string local_b0;
  Column local_90;
  undefined1 local_58 [8];
  Column nameCol;
  ConsoleReporter *this_local;
  StringRef name_local;
  
  name_local.m_start = (char *)name.m_size;
  this_local = (ConsoleReporter *)name.m_start;
  nameCol.m_initialIndent = (size_t)this;
  lazyPrintWithoutClosingBenchmarkTable(this);
  StringRef::operator_cast_to_string(&local_b0,(StringRef *)&this_local);
  TextFlow::Column::Column(&local_90,&local_b0);
  pTVar3 = Detail::unique_ptr<Catch::TablePrinter>::operator->(&this->m_tablePrinter);
  this_00 = TablePrinter::columnInfos(pTVar3);
  pvVar4 = std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::operator[](this_00,0);
  pCVar5 = TextFlow::Column::width(&local_90,pvVar4->width - 2);
  TextFlow::Column::Column((Column *)local_58,pCVar5);
  TextFlow::Column::~Column(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = true;
  TextFlow::Column::begin((const_iterator *)&__end1.m_addHyphen,(Column *)local_58);
  TextFlow::Column::end((const_iterator *)((long)&line.field_2 + 8),(Column *)local_58);
  while( true ) {
    bVar2 = TextFlow::Column::const_iterator::operator!=
                      ((const_iterator *)&__end1.m_addHyphen,
                       (const_iterator *)((long)&line.field_2 + 8));
    if (!bVar2) break;
    TextFlow::Column::const_iterator::operator*[abi_cxx11_
              ((string *)local_138,(const_iterator *)&__end1.m_addHyphen);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      pTVar3 = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
      pTVar3 = Catch::operator<<(pTVar3);
      pTVar3 = Catch::operator<<(pTVar3);
      Catch::operator<<(pTVar3);
    }
    pTVar3 = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
    pTVar3 = Catch::operator<<(pTVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_138);
    Catch::operator<<(pTVar3);
    std::__cxx11::string::~string((string *)local_138);
    TextFlow::Column::const_iterator::operator++((const_iterator *)&__end1.m_addHyphen);
  }
  TextFlow::Column::~Column((Column *)local_58);
  return;
}

Assistant:

void ConsoleReporter::benchmarkPreparing( StringRef name ) {
	lazyPrintWithoutClosingBenchmarkTable();

	auto nameCol = TextFlow::Column( static_cast<std::string>( name ) )
                       .width( m_tablePrinter->columnInfos()[0].width - 2 );

	bool firstLine = true;
	for (auto line : nameCol) {
		if (!firstLine)
			(*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
		else
			firstLine = false;

		(*m_tablePrinter) << line << ColumnBreak();
	}
}